

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

lua_Unsigned andaux(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int arg;
  
  uVar1 = lua_gettop(L);
  uVar3 = 0xffffffffffffffff;
  for (arg = 1; arg - (~((int)uVar1 >> 0x1f) & uVar1) != 1; arg = arg + 1) {
    uVar2 = luaL_checkinteger(L,arg);
    uVar3 = uVar3 & uVar2;
  }
  return uVar3 & 0xffffffff;
}

Assistant:

static lua_Unsigned andaux (lua_State *L) {
  int i, n = lua_gettop(L);
  lua_Unsigned r = ~(lua_Unsigned)0;
  for (i = 1; i <= n; i++)
    r &= checkunsigned(L, i);
  return trim(r);
}